

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O3

size_t jessilib::starts_with_lengthi<char,char16_t>
                 (basic_string_view<char,_std::char_traits<char>_> in_string,
                 basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix)

{
  int iVar1;
  int iVar2;
  char16_t *pcVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  char *extraout_RDX;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  jessilib *this;
  wchar32 wVar11;
  decode_result dVar12;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  
  pcVar3 = in_prefix._M_str;
  pcVar6 = (char *)in_prefix._M_len;
  pcVar10 = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  pcVar8 = pcVar6;
  if (pcVar6 == (char *)0x0 || this == (jessilib *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar4 = (char *)0x0;
    do {
      in_string_00._M_str = pcVar6;
      in_string_00._M_len = (size_t)pcVar10;
      dVar12 = decode_codepoint_utf8<char>(this,in_string_00);
      pcVar7 = (char *)dVar12.units;
      wVar11 = (wchar32)(ushort)*pcVar3;
      lVar9 = 1;
      pcVar6 = pcVar7;
      if ((pcVar8 != (char *)0x1) && ((wVar11 & 0xfc00U) == 0xd800)) {
        uVar5 = (ushort)pcVar3[1] & 0xfc00;
        pcVar6 = (char *)(ulong)uVar5;
        if (uVar5 == 0xdc00) {
          wVar11 = (uint)(ushort)*pcVar3 * 0x400 + (uint)(ushort)pcVar3[1] + L'\xfca02400';
          lVar9 = 2;
        }
      }
      if (pcVar7 == (char *)0x0) {
        return (size_t)(char *)0x0;
      }
      if (dVar12.codepoint != wVar11) {
        iVar1 = jessilib::fold(dVar12.codepoint);
        iVar2 = jessilib::fold(wVar11);
        pcVar6 = extraout_RDX;
        if (iVar1 != iVar2) {
          return (size_t)(char *)0x0;
        }
      }
      pcVar8 = pcVar8 + -lVar9;
      pcVar4 = pcVar4 + (long)pcVar7;
      this = this + -(long)pcVar7;
      if (this == (jessilib *)0x0) break;
      pcVar10 = pcVar10 + (long)pcVar7;
      pcVar3 = pcVar3 + lVar9;
    } while (pcVar8 != (char *)0x0);
  }
  pcVar6 = (char *)0x0;
  if (pcVar8 == (char *)0x0) {
    pcVar6 = pcVar4;
  }
  return (size_t)pcVar6;
}

Assistant:

size_t starts_with_lengthi(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, skip decoding each point
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (!equalsi(string_front.codepoint, prefix_front.codepoint)) {
			// Codepoints don't fold to same value
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}